

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall
diligent_spirv_cross::Compiler::StaticExpressionAccessHandler::handle
          (StaticExpressionAccessHandler *this,Op op,uint32_t *args,uint32_t length)

{
  if (op - OpAccessChain < 3) {
    if ((length < 3) || (args[2] == this->variable_id)) {
      return false;
    }
  }
  else if (op == OpLoad) {
    if (length < 3) {
      return false;
    }
    if ((args[2] == this->variable_id) && (this->static_expression == 0)) {
      return false;
    }
  }
  else if (op == OpStore) {
    if (length < 2) {
      return false;
    }
    if (*args == this->variable_id) {
      this->static_expression = args[1];
      this->write_count = this->write_count + 1;
    }
  }
  return true;
}

Assistant:

bool Compiler::StaticExpressionAccessHandler::handle(spv::Op op, const uint32_t *args, uint32_t length)
{
	switch (op)
	{
	case OpStore:
		if (length < 2)
			return false;
		if (args[0] == variable_id)
		{
			static_expression = args[1];
			write_count++;
		}
		break;

	case OpLoad:
		if (length < 3)
			return false;
		if (args[2] == variable_id && static_expression == 0) // Tried to read from variable before it was initialized.
			return false;
		break;

	case OpAccessChain:
	case OpInBoundsAccessChain:
	case OpPtrAccessChain:
		if (length < 3)
			return false;
		if (args[2] == variable_id) // If we try to access chain our candidate variable before we store to it, bail.
			return false;
		break;

	default:
		break;
	}

	return true;
}